

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_gettingTheGlobalDetectorDoesNotRestoreTheMemoryLeakOverloadsWhenTheyWereAlreadyOff_TestShell
::createTest(TEST_MemoryLeakWarningGlobalDetectorTest_gettingTheGlobalDetectorDoesNotRestoreTheMemoryLeakOverloadsWhenTheyWereAlreadyOff_TestShell
             *this)

{
  TEST_MemoryLeakWarningGlobalDetectorTest_gettingTheGlobalDetectorDoesNotRestoreTheMemoryLeakOverloadsWhenTheyWereAlreadyOff_Test
  *this_00;
  
  this_00 = (TEST_MemoryLeakWarningGlobalDetectorTest_gettingTheGlobalDetectorDoesNotRestoreTheMemoryLeakOverloadsWhenTheyWereAlreadyOff_Test
             *)operator_new(0x40,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                            ,0x138);
  TEST_MemoryLeakWarningGlobalDetectorTest_gettingTheGlobalDetectorDoesNotRestoreTheMemoryLeakOverloadsWhenTheyWereAlreadyOff_Test
  ::
  TEST_MemoryLeakWarningGlobalDetectorTest_gettingTheGlobalDetectorDoesNotRestoreTheMemoryLeakOverloadsWhenTheyWereAlreadyOff_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, gettingTheGlobalDetectorDoesNotRestoreTheMemoryLeakOverloadsWhenTheyWereAlreadyOff)
{
    MemoryLeakWarningPlugin::setGlobalDetector(NULLPTR, NULLPTR);
    MemoryLeakDetector* temporaryDetector = MemoryLeakWarningPlugin::getGlobalDetector();
    MemoryLeakFailure*  temporaryReporter = MemoryLeakWarningPlugin::getGlobalFailureReporter();

    MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();

    bool areNewDeleteOverloaded = MemoryLeakWarningPlugin::areNewDeleteOverloaded();
    MemoryLeakWarningPlugin::restoreNewDeleteOverloads();

    CHECK(!areNewDeleteOverloaded);

    delete temporaryReporter;
    delete temporaryDetector;
    MemoryLeakWarningPlugin::setGlobalDetector(NULLPTR, NULLPTR);
}